

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O0

FieldGenerator * __thiscall
google::protobuf::compiler::cpp::FieldGeneratorMap::get
          (FieldGeneratorMap *this,FieldDescriptor *field)

{
  Descriptor *pDVar1;
  char *pcVar2;
  scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator> *this_00;
  FieldGenerator *pFVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int __c;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  FieldGeneratorMap *this_local;
  
  local_18 = field;
  field_local = (FieldDescriptor *)this;
  pDVar1 = FieldDescriptor::containing_type(field);
  local_51 = 0;
  __c = extraout_EDX;
  if (pDVar1 != this->descriptor_) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/cpp/cpp_field.cc"
               ,0x86);
    local_51 = 1;
    field = (FieldDescriptor *)
            internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (field->containing_type()) == (descriptor_): ");
    internal::LogFinisher::operator=(local_65,(LogMessage *)field);
    __c = extraout_EDX_00;
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
    __c = extraout_EDX_01;
  }
  pcVar2 = FieldDescriptor::index(local_18,(char *)field,__c);
  this_00 = internal::
            scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator>_>
            ::operator[](&this->field_generators_,(long)(int)pcVar2);
  pFVar3 = internal::scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator>::operator*(this_00)
  ;
  return pFVar3;
}

Assistant:

const FieldGenerator& FieldGeneratorMap::get(
    const FieldDescriptor* field) const {
  GOOGLE_CHECK_EQ(field->containing_type(), descriptor_);
  return *field_generators_[field->index()];
}